

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TexSubImageCubeEmptyTexCase::createTexture
          (TexSubImageCubeEmptyTexCase *this)

{
  ContextWrapper *this_00;
  deUint32 format;
  deUint32 type;
  uint uVar1;
  deUint32 dVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int width;
  int height;
  int iVar6;
  long lVar7;
  int ndx;
  int level;
  deUint32 tex;
  int local_f0;
  int local_ec;
  ulong local_e8;
  ContextWrapper *local_e0;
  long local_d8;
  ulong local_d0;
  TextureFormat fmt;
  Random rnd;
  TextureLevel data;
  Vec4 gMin;
  Vector<float,_4> local_78;
  Vec4 gMax;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    iVar6 = 1;
  }
  else {
    uVar5 = (this->super_TextureSpecCase).m_width;
    uVar1 = 0x20;
    uVar4 = uVar1;
    if (uVar5 != 0) {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    uVar5 = (this->super_TextureSpecCase).m_height;
    if (uVar5 != 0) {
      uVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    iVar6 = 0x1f - uVar1;
    if ((int)(0x1f - uVar1) < (int)(0x1f - uVar4)) {
      iVar6 = 0x1f - uVar4;
    }
    iVar6 = iVar6 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar2 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_e0 = this_00;
  for (level = 0; level != iVar6; level = level + 1) {
    width = (this->super_TextureSpecCase).m_width >> ((byte)level & 0x1f);
    if (width < 2) {
      width = 1;
    }
    height = (this->super_TextureSpecCase).m_height >> ((byte)level & 0x1f);
    if (height < 2) {
      height = 1;
    }
    for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
      sglr::ContextWrapper::glTexImage2D
                (local_e0,*(deUint32 *)((long)&s_cubeMapFaces + lVar7),level,this->m_format,width,
                 height,0,this->m_format,this->m_dataType,(void *)0x0);
    }
  }
  uVar3 = 0;
  local_f0 = iVar6;
  while ((int)uVar3 != local_f0) {
    local_ec = (this->super_TextureSpecCase).m_width >> ((byte)uVar3 & 0x1f);
    if (local_ec < 2) {
      local_ec = 1;
    }
    uVar5 = (this->super_TextureSpecCase).m_height >> ((byte)uVar3 & 0x1f);
    local_d0 = (ulong)uVar5;
    if ((int)uVar5 < 2) {
      local_d0 = 1;
    }
    local_e8 = uVar3;
    tcu::TextureLevel::setSize(&data,local_ec,(int)local_d0,1);
    lVar7 = 0;
    while( true ) {
      if (lVar7 == 0x18) break;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
      randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_58,
                      (Vector<float,_4> *)&gMax);
      local_d8 = lVar7;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector(&local_78,1.0);
      randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_58,&local_78);
      tcu::TextureLevel::getAccess(&local_58,&data);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      dVar2 = *(deUint32 *)((long)&s_cubeMapFaces + local_d8);
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&data);
      sglr::ContextWrapper::glTexSubImage2D
                (local_e0,dVar2,(int)local_e8,0,0,local_ec,(int)local_d0,format,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      lVar7 = local_d8 + 4;
    }
    uVar3 = (ulong)((int)local_e8 + 1);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Specify storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify data using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}